

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertiaNonLinearParametrization.cpp
# Opt level: O3

Matrix<double,_6,_1,_0,_6,_1> * iDynTree::vech(Matrix<double,_3,_3,_1,_3,_3> *mat)

{
  double dVar1;
  Matrix<double,_6,_1,_0,_6,_1> *vec;
  Matrix<double,_6,_1,_0,_6,_1> *in_RDI;
  
  dVar1 = (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array
          [1];
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0] =
       (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[0]
  ;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1] =
       dVar1;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2] =
       (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[2]
  ;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3] =
       (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[4]
  ;
  dVar1 = (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array
          [8];
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4] =
       (mat->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[7]
  ;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5] =
       dVar1;
  return in_RDI;
}

Assistant:

Eigen::Matrix<double, 6, 1> vech(const Eigen::Matrix<double, 3, 3, Eigen::RowMajor> & mat)
{
    Eigen::Matrix<double, 6, 1> vec;

    vec(0) = mat(0,0);
    vec(1) = mat(0,1);
    vec(2) = mat(0,2);
    vec(3) = mat(1,1);
    vec(4) = mat(2,1);
    vec(5) = mat(2,2);

    return vec;
}